

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_calc_verify_tls_sha256(mbedtls_ssl_context *ssl,uchar *hash,size_t *hlen)

{
  int iVar1;
  size_t *hlen_local;
  uchar *hash_local;
  mbedtls_ssl_context *ssl_local;
  
  iVar1 = ssl_calc_verify_tls_legacy(ssl,&ssl->handshake->fin_sha256,hash,hlen);
  return iVar1;
}

Assistant:

int ssl_calc_verify_tls_sha256(const mbedtls_ssl_context *ssl,
                               unsigned char *hash,
                               size_t *hlen)
{
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    return ssl_calc_verify_tls_psa(ssl, &ssl->handshake->fin_sha256_psa, 32,
                                   hash, hlen);
#else
    return ssl_calc_verify_tls_legacy(ssl, &ssl->handshake->fin_sha256,
                                      hash, hlen);
#endif /* MBEDTLS_USE_PSA_CRYPTO */
}